

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  Impl *this_00;
  uint64_t id_00;
  CapTableReader *pCVar1;
  Maybe<capnp::_::RawSchema_*const_&> MVar2;
  SegmentReader *pSVar3;
  char (*in_R8) [2];
  RawSchema *pRVar4;
  Which WVar5;
  StringPtr name;
  undefined1 local_ac [4];
  uint64_t id_local;
  Fault f;
  Reader node;
  uint local_5c;
  PointerReader local_58;
  
  id_local = id;
  node._reader.segment = (SegmentReader *)id;
  MVar2 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&this->loader->schemas,
                     (unsigned_long *)&node);
  id_00 = id_local;
  if (MVar2.ptr == (RawSchema **)0x0) {
    pRVar4 = (RawSchema *)0x0;
  }
  else {
    pRVar4 = *MVar2.ptr;
  }
  if (pRVar4 == (RawSchema *)0x0) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              ((String *)&node,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x1d34bd,in_R8);
    pSVar3 = node._reader.segment;
    if (node._reader.capTable == (CapTableReader *)0x0) {
      pSVar3 = (SegmentReader *)0x1e3c21;
    }
    name.content.size_ =
         (long)&(node._reader.capTable)->_vptr_CapTableReader +
         (ulong)(node._reader.capTable == (CapTableReader *)0x0);
    name.content.ptr = (char *)pSVar3;
    local_58.capTable = (CapTableReader *)Impl::loadEmpty(this_00,id_00,name,expectedKind,true);
    local_58.segment = (SegmentReader *)id_00;
    f.exception = (Exception *)local_ac;
    kj::
    Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
    ::
    upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
              ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                *)&this->dependencies,(Entry *)&local_58,(anon_class_8_1_6f242a07 *)&f);
    pCVar1 = node._reader.capTable;
    pSVar3 = node._reader.segment;
    if (node._reader.segment != (SegmentReader *)0x0) {
      node._reader.segment = (SegmentReader *)0x0;
      node._reader.capTable = (CapTableReader *)0x0;
      (*(code *)**node._reader.data)(node._reader.data,pSVar3,1,pCVar1,pCVar1,0);
    }
  }
  else {
    local_58.pointer = (WirePointer *)pRVar4->encodedNode;
    local_58._0_16_ = ZEXT816(0);
    local_58.nestingLimit = 0x7fffffff;
    WVar5 = FILE;
    _::PointerReader::getStruct(&node._reader,&local_58,(word *)0x0);
    if (0x6f < node._reader.dataSize) {
      WVar5 = *(Which *)((long)node._reader.data + 0xc);
    }
    if (WVar5 == expectedKind) {
      local_58.capTable = (CapTableReader *)pRVar4;
      local_58.segment = (SegmentReader *)id_local;
      f.exception = (Exception *)local_ac;
      kj::
      Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
      ::
      upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
                ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                  *)&this->dependencies,(Entry *)&local_58,(anon_class_8_1_6f242a07 *)&f);
    }
    else {
      local_5c = 0;
      local_ac = (undefined1  [4])(uint)expectedKind;
      if (0x6f < node._reader.dataSize) {
        local_5c = (uint)*(ushort *)((long)node._reader.data + 0xc);
      }
      local_58._0_16_ = capnp::schema::Node::Reader::getDisplayName(&node);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x25d,FAILED,"node.which() == expectedKind",
                 "\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
                 ,(char (*) [46])"expected a different kind of node for this ID",&id_local,
                 (uint *)local_ac,&local_5c,(Reader *)&local_58);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }